

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::DockContextInitialize(ImGuiContext *ctx)

{
  ImU32 IVar1;
  ImGuiDockContext *pIVar2;
  ImGuiSettingsHandler local_40;
  
  pIVar2 = (ImGuiDockContext *)MemAlloc(0x38);
  (pIVar2->Nodes).Data.Size = 0;
  (pIVar2->Nodes).Data.Capacity = 0;
  (pIVar2->Nodes).Data.Data = (ImGuiStoragePair *)0x0;
  (pIVar2->Requests).Size = 0;
  (pIVar2->Requests).Capacity = 0;
  (pIVar2->Requests).Data = (ImGuiDockRequest *)0x0;
  (pIVar2->SettingsNodes).Size = 0;
  (pIVar2->SettingsNodes).Capacity = 0;
  (pIVar2->SettingsNodes).Data = (ImGuiDockNodeSettings *)0x0;
  pIVar2->WantFullRebuild = false;
  ctx->DockContext = pIVar2;
  local_40.UserData = (void *)0x0;
  local_40.ReadLineFn =
       (_func_void_ImGuiContext_ptr_ImGuiSettingsHandler_ptr_void_ptr_char_ptr *)0x0;
  local_40.WriteAllFn =
       (_func_void_ImGuiContext_ptr_ImGuiSettingsHandler_ptr_ImGuiTextBuffer_ptr *)0x0;
  local_40.TypeHash = 0;
  local_40._12_4_ = 0;
  local_40.ReadOpenFn = (_func_void_ptr_ImGuiContext_ptr_ImGuiSettingsHandler_ptr_char_ptr *)0x0;
  local_40.TypeName = "Docking";
  IVar1 = ImHashStr("Docking",0,0);
  local_40.TypeHash = IVar1;
  local_40.ReadOpenFn = DockSettingsHandler_ReadOpen;
  local_40.ReadLineFn = DockSettingsHandler_ReadLine;
  local_40.WriteAllFn = DockSettingsHandler_WriteAll;
  ImVector<ImGuiSettingsHandler>::push_back(&ctx->SettingsHandlers,&local_40);
  return;
}

Assistant:

void ImGui::DockContextInitialize(ImGuiContext* ctx)
{
    ImGuiContext& g = *ctx;
    IM_ASSERT(g.DockContext == NULL);
    g.DockContext = IM_NEW(ImGuiDockContext)();

    // Add .ini handle for persistent docking data
    ImGuiSettingsHandler ini_handler;
    ini_handler.TypeName = "Docking";
    ini_handler.TypeHash = ImHashStr("Docking");
    ini_handler.ReadOpenFn = DockSettingsHandler_ReadOpen;
    ini_handler.ReadLineFn = DockSettingsHandler_ReadLine;
    ini_handler.WriteAllFn = DockSettingsHandler_WriteAll;
    g.SettingsHandlers.push_back(ini_handler);
}